

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::Reader::readNumber(Reader *this)

{
  byte *pbVar1;
  uint uVar2;
  
  pbVar1 = (byte *)this->current_;
  while ((pbVar1 != (byte *)this->end_ &&
         (((byte)(*pbVar1 - 0x30) < 10 ||
          ((uVar2 = *pbVar1 - 0x2b, uVar2 < 0x3b &&
           ((0x40000000400000dU >> ((ulong)uVar2 & 0x3f) & 1) != 0))))))) {
    pbVar1 = pbVar1 + 1;
    this->current_ = (Location)pbVar1;
  }
  return;
}

Assistant:

void Reader::readNumber() {
  while (current_ != end_) {
    if (!(*current_ >= '0' && *current_ <= '9') &&
        !in(*current_, '.', 'e', 'E', '+', '-'))
      break;
    ++current_;
  }
}